

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int iscleared(TValue *o,int iskey)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = o->tt;
  uVar3 = 0;
  if (3 < iVar2) {
    bVar1 = (((o->value).gc)->gch).marked;
    if (iVar2 == 4) {
      (((o->value).gc)->gch).marked = bVar1 & 0xfc;
      return 0;
    }
    if ((bVar1 & 3) != 0) {
      return 1;
    }
    uVar3 = 0;
    if (iskey == 0 && iVar2 == 7) {
      uVar3 = bVar1 >> 3 & 1;
    }
  }
  return uVar3;
}

Assistant:

static int iscleared(const TValue*o,int iskey){
if(!iscollectable(o))return 0;
if(ttisstring(o)){
stringmark(rawtsvalue(o));
return 0;
}
return iswhite(gcvalue(o))||
(ttisuserdata(o)&&(!iskey&&isfinalized(uvalue(o))));
}